

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentEntitySystem.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::SilentEntitySystem::Decode(SilentEntitySystem *this,KDataStream *stream)

{
  pointer pEVar1;
  pointer pEVar2;
  KUINT16 KVar3;
  KException *this_00;
  ushort uVar4;
  pointer pEVar5;
  KString local_50;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  if (KVar3 < 0xc) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Decode","");
    KException::KException(this_00,&local_50,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pEVar1 = (this->m_vEA).
           super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->m_vEA).
           super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar5 = pEVar1;
  if (pEVar2 != pEVar1) {
    do {
      (**(pEVar5->super_DataTypeBase)._vptr_DataTypeBase)(pEVar5);
      pEVar5 = pEVar5 + 1;
    } while (pEVar5 != pEVar2);
    (this->m_vEA).
    super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar1;
  }
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumEnts);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumOfAppearanceRecords);
  (*(this->m_EntTyp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EntTyp,stream);
  if (this->m_ui16NumOfAppearanceRecords != 0) {
    uVar4 = 0;
    do {
      DATA_TYPE::EntityAppearance::EntityAppearance((EntityAppearance *)&local_50,stream);
      std::
      vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
      ::emplace_back<KDIS::DATA_TYPE::EntityAppearance>(&this->m_vEA,(EntityAppearance *)&local_50);
      DATA_TYPE::EntityAppearance::~EntityAppearance((EntityAppearance *)&local_50);
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->m_ui16NumOfAppearanceRecords);
  }
  return;
}

Assistant:

void SilentEntitySystem::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < SILENT_ENTITY_SYSTEM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vEA.clear();

    stream >> m_ui16NumEnts
           >> m_ui16NumOfAppearanceRecords
           >> KDIS_STREAM m_EntTyp;

    for( KUINT16 i = 0; i < m_ui16NumOfAppearanceRecords; ++i )
    {
        m_vEA.push_back( EntityAppearance( stream ) );
    }
}